

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O2

bool bssl::parse_ech_config
               (CBS *cbs,ECHConfig *out,bool *out_supported,bool all_extensions_mandatory)

{
  uint8_t *puVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  size_t extraout_RDX;
  byte bVar5;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> public_name_00;
  uint16_t type;
  uint16_t version;
  CBS contents;
  CBS public_name;
  CBS extensions;
  CBS cipher_suites;
  CBS public_key;
  CBS ech_config;
  CBS body;
  
  puVar1 = cbs->data;
  sVar2 = cbs->len;
  iVar4 = CBS_get_u16(cbs,&version);
  if ((iVar4 == 0) || (iVar4 = CBS_get_u16_length_prefixed(cbs,&contents), iVar4 == 0)) {
    iVar4 = 0x1a6;
LAB_00132a95:
    bVar3 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,iVar4);
  }
  else {
    if (version == 0xfe0d) {
      in.size_ = sVar2 - cbs->len;
      in.data_ = puVar1;
      bVar3 = Array<unsigned_char>::CopyFrom(&out->raw,in);
      if (!bVar3) {
        return false;
      }
      ech_config.data = (out->raw).data_;
      ech_config.len = (out->raw).size_;
      iVar4 = CBS_skip(&ech_config,2);
      if ((((((iVar4 == 0) ||
             (iVar4 = CBS_get_u16_length_prefixed(&ech_config,&contents), iVar4 == 0)) ||
            (iVar4 = CBS_get_u8(&contents,&out->config_id), iVar4 == 0)) ||
           (((iVar4 = CBS_get_u16(&contents,&out->kem_id), iVar4 == 0 ||
             (iVar4 = CBS_get_u16_length_prefixed(&contents,&public_key), iVar4 == 0)) ||
            ((public_key.len == 0 ||
             ((iVar4 = CBS_get_u16_length_prefixed(&contents,&cipher_suites), iVar4 == 0 ||
              ((cipher_suites.len & 3) != 0 || cipher_suites.len == 0)))))))) ||
          (iVar4 = CBS_get_u8(&contents,&out->maximum_name_length), iVar4 == 0)) ||
         ((((iVar4 = CBS_get_u8_length_prefixed(&contents,&public_name), iVar4 == 0 ||
            (public_name.len == 0)) ||
           (iVar4 = CBS_get_u16_length_prefixed(&contents,&extensions), iVar4 == 0)) ||
          (contents.len != 0)))) {
        iVar4 = 0x1c5;
        goto LAB_00132a95;
      }
      public_name_00.size_ = extraout_RDX;
      public_name_00.data_ = (uchar *)public_name.len;
      bVar3 = ssl_is_valid_ech_public_name((bssl *)public_name.data,public_name_00);
      if (!bVar3) goto LAB_00132a9c;
      (out->public_key).data_ = public_key.data;
      (out->public_key).size_ = public_key.len;
      (out->public_name).data_ = public_name.data;
      (out->public_name).size_ = public_name.len;
      (out->cipher_suites).data_ = cipher_suites.data;
      (out->cipher_suites).size_ = cipher_suites.len;
      bVar5 = 0;
      while (extensions.len != 0) {
        iVar4 = CBS_get_u16(&extensions,&type);
        if ((iVar4 == 0) || (iVar4 = CBS_get_u16_length_prefixed(&extensions,&body), iVar4 == 0)) {
          iVar4 = 0x1dd;
          goto LAB_00132a95;
        }
        if (all_extensions_mandatory) {
          bVar5 = 1;
        }
        if ((short)type < 0) {
          bVar5 = 1;
        }
      }
      *out_supported = (bool)(~bVar5 & 1);
    }
    else {
LAB_00132a9c:
      *out_supported = false;
    }
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool parse_ech_config(CBS *cbs, ECHConfig *out, bool *out_supported,
                             bool all_extensions_mandatory) {
  uint16_t version;
  CBS orig = *cbs;
  CBS contents;
  if (!CBS_get_u16(cbs, &version) ||
      !CBS_get_u16_length_prefixed(cbs, &contents)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (version != kECHConfigVersion) {
    *out_supported = false;
    return true;
  }

  // Make a copy of the ECHConfig and parse from it, so the results alias into
  // the saved copy.
  if (!out->raw.CopyFrom(
          Span(CBS_data(&orig), CBS_len(&orig) - CBS_len(cbs)))) {
    return false;
  }

  CBS ech_config(out->raw);
  CBS public_name, public_key, cipher_suites, extensions;
  if (!CBS_skip(&ech_config, 2) ||  // version
      !CBS_get_u16_length_prefixed(&ech_config, &contents) ||
      !CBS_get_u8(&contents, &out->config_id) ||
      !CBS_get_u16(&contents, &out->kem_id) ||
      !CBS_get_u16_length_prefixed(&contents, &public_key) ||
      CBS_len(&public_key) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &cipher_suites) ||
      CBS_len(&cipher_suites) == 0 || CBS_len(&cipher_suites) % 4 != 0 ||
      !CBS_get_u8(&contents, &out->maximum_name_length) ||
      !CBS_get_u8_length_prefixed(&contents, &public_name) ||
      CBS_len(&public_name) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &extensions) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (!ssl_is_valid_ech_public_name(public_name)) {
    // TODO(https://crbug.com/boringssl/275): The draft says ECHConfigs with
    // invalid public names should be ignored, but LDH syntax failures are
    // unambiguously invalid.
    *out_supported = false;
    return true;
  }

  out->public_key = public_key;
  out->public_name = public_name;
  // This function does not ensure |out->kem_id| and |out->cipher_suites| use
  // supported algorithms. The caller must do this.
  out->cipher_suites = cipher_suites;

  bool has_unknown_mandatory_extension = false;
  while (CBS_len(&extensions) != 0) {
    uint16_t type;
    CBS body;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    // We currently do not support any extensions.
    if (type & 0x8000 || all_extensions_mandatory) {
      // Extension numbers with the high bit set are mandatory. Continue parsing
      // to enforce syntax, but we will ultimately ignore this ECHConfig as a
      // client and reject it as a server.
      has_unknown_mandatory_extension = true;
    }
  }

  *out_supported = !has_unknown_mandatory_extension;
  return true;
}